

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  size_t offbaseFound;
  size_t local_b8;
  int *local_b0;
  ZSTD_matchState_t *local_a8;
  int *local_a0;
  ulong local_98;
  int *local_90;
  uint local_84;
  seqStore_t *local_80;
  int *local_78;
  BYTE *local_70;
  int *local_68;
  uint local_5c;
  BYTE *local_58;
  int *local_50;
  BYTE *local_48;
  BYTE *local_40;
  uint *local_38;
  
  pBVar2 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  local_98 = (ulong)local_84;
  uVar9 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar9 < 6) {
    uVar11 = uVar9;
  }
  uVar9 = 4;
  if (4 < uVar11) {
    uVar9 = uVar11;
  }
  local_70 = pBVar2 + local_98;
  uVar11 = *rep;
  pZVar3 = ms->dictMatchState;
  local_78 = (int *)(pZVar3->window).nextSrc;
  local_58 = (pZVar3->window).base;
  local_40 = local_58 + (pZVar3->window).dictLimit;
  uVar10 = ((int)src - ((int)local_70 + (int)local_40)) + (int)local_78;
  piVar19 = (int *)((long)src + (ulong)(uVar10 == 0));
  local_90 = (int *)src;
  if (uVar10 < uVar11) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar23 = rep[1];
  if (uVar10 < uVar23) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar16 = (int *)((long)src + srcSize);
  local_68 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar19 < local_68) {
    local_84 = ((int)local_58 - (int)local_78) + local_84;
    local_48 = local_58 + -(ulong)local_84;
    local_50 = piVar16 + -8;
    local_b0 = piVar16;
    local_a8 = ms;
    local_80 = seqStore;
    local_38 = rep;
    do {
      local_a0 = (int *)((long)piVar19 + 1);
      iVar26 = (int)pBVar2;
      uVar10 = (((int)piVar19 - iVar26) - uVar11) + 1;
      piVar15 = (int *)(pBVar2 + uVar10);
      if (uVar10 < (uint)local_98) {
        piVar15 = (int *)(local_58 + (uVar10 - local_84));
      }
      local_5c = uVar23;
      if ((uVar10 - (uint)local_98 < 0xfffffffd) && (*piVar15 == *local_a0)) {
        piVar14 = piVar16;
        if (uVar10 < (uint)local_98) {
          piVar14 = local_78;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar15 + 1),(BYTE *)piVar16,
                            (BYTE *)piVar14,local_70);
        uVar18 = sVar12 + 4;
        piVar16 = local_b0;
      }
      else {
        uVar18 = 0;
      }
      local_b8 = 999999999;
      if (uVar9 == 6) {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_6
                           (local_a8,(BYTE *)piVar19,(BYTE *)piVar16,&local_b8);
      }
      else if (uVar9 == 5) {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_5
                           (local_a8,(BYTE *)piVar19,(BYTE *)piVar16,&local_b8);
      }
      else {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_4
                           (local_a8,(BYTE *)piVar19,(BYTE *)piVar16,&local_b8);
      }
      uVar25 = uVar18;
      if (uVar18 < uVar13) {
        uVar25 = uVar13;
      }
      if (uVar25 < 4) {
        uVar18 = (long)piVar19 - (long)local_90;
        piVar19 = (int *)((long)piVar19 + (uVar18 >> 8) + 1);
        local_a8->lazySkipping = (uint)(0x7ff < uVar18);
        piVar16 = local_b0;
        uVar23 = local_5c;
      }
      else {
        piVar16 = piVar19;
        uVar24 = local_b8;
        if (uVar13 <= uVar18) {
          piVar16 = local_a0;
          uVar24 = 1;
        }
        local_a0 = piVar16;
        if (piVar19 < local_68) {
          do {
            piVar16 = (int *)((long)piVar19 + 1);
            uVar10 = ((int)piVar16 - iVar26) - uVar11;
            piVar15 = (int *)(pBVar2 + uVar10);
            if (uVar10 < (uint)local_98) {
              piVar15 = (int *)(local_58 + (uVar10 - local_84));
            }
            if ((uVar10 - (uint)local_98 < 0xfffffffd) && (*piVar15 == *piVar16)) {
              piVar14 = local_b0;
              if (uVar10 < (uint)local_98) {
                piVar14 = local_78;
              }
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar15 + 1),(BYTE *)local_b0
                                  ,(BYTE *)piVar14,local_70);
              uVar10 = (uint)uVar24;
              if (uVar10 == 0) goto LAB_001de629;
              if (sVar12 < 0xfffffffffffffffc) {
                uVar23 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                  }
                }
                if ((int)((uVar23 ^ 0x1f) + (int)uVar25 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                  uVar24 = 1;
                  uVar25 = sVar12 + 4;
                  local_a0 = piVar16;
                }
              }
            }
            local_b8 = 999999999;
            if (uVar9 == 6) {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_6
                                 (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
            }
            else if (uVar9 == 5) {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_5
                                 (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
            }
            else {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_4
                                 (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
            }
            uVar10 = (uint)local_b8;
            if ((uVar10 == 0) || (uVar23 = (uint)uVar24, uVar23 == 0)) {
LAB_001de629:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            bVar6 = true;
            if (3 < uVar18) {
              iVar5 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 4 + -0x1b) < (int)uVar18 * 4 - iVar5) {
                bVar6 = false;
                uVar24 = local_b8;
                uVar25 = uVar18;
                local_a0 = piVar16;
              }
            }
            if (bVar6) {
              if (local_68 <= piVar16) break;
              piVar16 = (int *)((long)piVar19 + 2);
              uVar10 = ((int)piVar16 - iVar26) - uVar11;
              piVar15 = (int *)(pBVar2 + uVar10);
              if (uVar10 < (uint)local_98) {
                piVar15 = (int *)(local_58 + (uVar10 - local_84));
              }
              if ((uVar10 - (uint)local_98 < 0xfffffffd) && (*piVar15 == *piVar16)) {
                piVar14 = local_b0;
                if (uVar10 < (uint)local_98) {
                  piVar14 = local_78;
                }
                sVar12 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar15 + 1),
                                    (BYTE *)local_b0,(BYTE *)piVar14,local_70);
                uVar10 = (uint)uVar24;
                if (uVar10 == 0) goto LAB_001de629;
                if (sVar12 < 0xfffffffffffffffc) {
                  uVar23 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                    }
                  }
                  if ((int)((uVar23 ^ 0x1f) + (int)uVar25 * 4 + -0x1e) < (int)(sVar12 + 4) * 4) {
                    uVar24 = 1;
                    uVar25 = sVar12 + 4;
                    local_a0 = piVar16;
                  }
                }
              }
              local_b8 = 999999999;
              if (uVar9 == 6) {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_6
                                   (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
              }
              else if (uVar9 == 5) {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_5
                                   (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
              }
              else {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_4
                                   (local_a8,(BYTE *)piVar16,(BYTE *)local_b0,&local_b8);
              }
              uVar10 = (uint)local_b8;
              if ((uVar10 == 0) || (uVar23 = (uint)uVar24, uVar23 == 0)) goto LAB_001de629;
              bVar6 = true;
              if (3 < uVar18) {
                iVar5 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                uVar10 = 0x1f;
                if (uVar23 != 0) {
                  for (; uVar23 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 4 + -0x18) < (int)uVar18 * 4 - iVar5) {
                  bVar6 = false;
                  uVar24 = local_b8;
                  uVar25 = uVar18;
                  local_a0 = piVar16;
                }
              }
              if (bVar6) break;
            }
            piVar19 = piVar16;
          } while (piVar16 < local_68);
        }
        piVar19 = local_a0;
        uVar10 = uVar11;
        uVar23 = local_5c;
        if (3 < uVar24) {
          pBVar20 = (BYTE *)((long)local_a0 + (-(long)pBVar2 - uVar24) + -0xfffffffd);
          pBVar21 = pBVar2;
          pBVar22 = local_70;
          if ((uint)pBVar20 < (uint)local_98) {
            pBVar21 = local_48;
            pBVar22 = local_40;
          }
          if ((local_90 < local_a0) &&
             (uVar18 = (ulong)pBVar20 & 0xffffffff, pBVar22 < pBVar21 + uVar18)) {
            pBVar21 = pBVar21 + uVar18;
            do {
              pBVar21 = pBVar21 + -1;
              piVar16 = (int *)((long)piVar19 + -1);
              if ((*(BYTE *)piVar16 != *pBVar21) ||
                 (uVar25 = uVar25 + 1, piVar19 = piVar16, piVar16 <= local_90)) break;
            } while (pBVar22 < pBVar21);
          }
          uVar10 = (U32)uVar24 - 3;
          uVar23 = uVar11;
        }
        if (local_80->maxNbSeq <=
            (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3)) {
LAB_001de648:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_80->maxNbLit) {
LAB_001de667:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar18 = (long)piVar19 - (long)local_90;
        pBVar22 = local_80->lit;
        if (local_80->litStart + local_80->maxNbLit < pBVar22 + uVar18) {
LAB_001de6c4:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < piVar19) {
LAB_001de6a5:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_a0 = piVar19;
        if (local_50 < piVar19) {
          ZSTD_safecopyLiterals(pBVar22,(BYTE *)local_90,(BYTE *)piVar19,(BYTE *)local_50);
        }
        else {
          uVar7 = *(undefined8 *)(local_90 + 2);
          *(undefined8 *)pBVar22 = *(undefined8 *)local_90;
          *(undefined8 *)(pBVar22 + 8) = uVar7;
          if (0x10 < uVar18) {
            pBVar22 = local_80->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar22 + 0x10 + (-0x10 - (long)(local_90 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_90 + 6);
            *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_90 + 4);
            *(undefined8 *)(pBVar22 + 0x18) = uVar7;
            if (0x20 < (long)uVar18) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_90 + lVar17 + 0x20);
                uVar7 = puVar1[1];
                pBVar21 = pBVar22 + lVar17 + 0x20;
                *(undefined8 *)pBVar21 = *puVar1;
                *(undefined8 *)(pBVar21 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_90 + lVar17 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar21 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                lVar17 = lVar17 + 0x20;
              } while (pBVar21 + 0x20 < pBVar22 + uVar18);
            }
          }
        }
        psVar8 = local_80;
        local_80->lit = local_80->lit + uVar18;
        if (0xffff < uVar18) {
          if (local_80->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_literalLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)local_80->sequences - (long)local_80->sequencesStart) >> 3);
        }
        psVar4 = local_80->sequences;
        psVar4->litLength = (U16)uVar18;
        psVar4->offBase = (U32)uVar24;
        if (uVar25 < 3) {
LAB_001de686:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar25 - 3) {
          if (local_80->longLengthType != ZSTD_llt_none) {
LAB_001de6e3:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_80->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar25 - 3);
        local_80->sequences = psVar4 + 1;
        if (local_a8->lazySkipping != 0) {
          local_a8->lazySkipping = 0;
        }
        piVar19 = (int *)((long)local_a0 + uVar25);
        pBVar22 = local_48;
        piVar16 = local_b0;
        local_90 = piVar19;
        do {
          uVar11 = uVar10;
          if (local_68 < piVar19) break;
          uVar11 = ((int)piVar19 - iVar26) - uVar23;
          pBVar21 = pBVar2;
          if (uVar11 < (uint)local_98) {
            pBVar21 = pBVar22;
          }
          if ((uVar11 - (uint)local_98 < 0xfffffffd) && (*(int *)(pBVar21 + uVar11) == *piVar19)) {
            piVar15 = piVar16;
            if (uVar11 < (uint)local_98) {
              piVar15 = local_78;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar21 + uVar11) + 4),
                                (BYTE *)piVar16,(BYTE *)piVar15,local_70);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_001de648;
            if (0x20000 < psVar8->maxNbLit) goto LAB_001de667;
            pBVar22 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar22) goto LAB_001de6c4;
            if (local_b0 < local_90) goto LAB_001de6a5;
            if (local_50 < local_90) {
              ZSTD_safecopyLiterals(pBVar22,(BYTE *)local_90,(BYTE *)local_90,(BYTE *)local_50);
            }
            else {
              uVar7 = *(undefined8 *)(local_90 + 2);
              *(undefined8 *)pBVar22 = *(undefined8 *)local_90;
              *(undefined8 *)(pBVar22 + 8) = uVar7;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar12 + 4 < 3) goto LAB_001de686;
            if (0xffff < sVar12 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_001de6e3;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar12 + 1);
            psVar8->sequences = psVar4 + 1;
            piVar19 = (int *)((long)piVar19 + sVar12 + 4);
            bVar6 = true;
            pBVar22 = local_48;
            piVar16 = local_b0;
            uVar11 = uVar10;
            uVar10 = uVar23;
            local_90 = piVar19;
          }
          else {
            bVar6 = false;
            uVar11 = uVar23;
          }
          uVar23 = uVar11;
          uVar11 = uVar10;
        } while (bVar6);
      }
      rep = local_38;
    } while (piVar19 < local_68);
  }
  *rep = uVar11;
  rep[1] = uVar23;
  return (long)piVar16 - (long)local_90;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}